

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian.cpp
# Opt level: O1

Vector<double,_std::allocator<double>_> * __thiscall
amrex::MLNodeLaplacian::getSolvabilityOffset
          (Vector<double,_std::allocator<double>_> *__return_storage_ptr__,MLNodeLaplacian *this,
          int amrlev,int mglev,Any *a_rhs)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  double dVar3;
  LinOpBCType LVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  pointer paVar9;
  pointer paVar10;
  double *pdVar11;
  long lVar12;
  double *pdVar13;
  undefined8 uVar14;
  bool bVar15;
  int i;
  uint uVar16;
  FabArray<amrex::FArrayBox> *pFVar17;
  EBFArrayBoxFactory *this_00;
  long lVar18;
  int *piVar19;
  FabArray<amrex::FArrayBox> *pFVar20;
  long lVar21;
  int iVar22;
  IndexType IVar23;
  int iVar24;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var25;
  ulong uVar26;
  int iVar27;
  long lVar28;
  Array4<const_double> *pAVar29;
  long lVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  initializer_list<std::reference_wrapper<double>_> __l;
  initializer_list<double> __l_00;
  initializer_list<std::reference_wrapper<double>_> __l_01;
  initializer_list<double> __l_02;
  gpu_tuple_impl<0UL,_double,_double> gVar34;
  gpu_tuple_impl<0UL,_double,_double> gVar35;
  ReduceOps<amrex::ReduceOpSum,_amrex::ReduceOpSum> reduce_op;
  Box nddom;
  Real s2;
  Real s1;
  MFIter mfi;
  ReduceOps<amrex::ReduceOpSum,_amrex::ReduceOpSum> local_211;
  gpu_tuple_element<0UL,_double> local_210;
  gpu_tuple_element<1UL,_double> local_208;
  IndexType local_1fc;
  int local_1f8;
  uint local_1f4;
  ulong local_1f0;
  IntVect local_1e4;
  undefined8 local_1d8;
  int iStack_1d0;
  int aiStack_1cc [2];
  undefined8 uStack_1c4;
  ulong local_1b8;
  int local_1ac;
  undefined1 local_1a8 [120];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_130;
  int local_128;
  int local_124;
  vector<double,_std::allocator<double>_> *local_120;
  pointer local_118;
  double *local_110 [2];
  _Bit_type *local_100;
  undefined1 local_f8 [16];
  code *local_e8;
  MFIter local_d8;
  Array4<const_double> *local_78;
  Array4<const_double> *local_70;
  Array4<const_double> *local_68;
  vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_> local_60;
  vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_> local_48;
  
  if ((this->super_MLNodeLinOp).m_coarsening_strategy == RAP) {
    pFVar17 = &Any::get<amrex::MultiFab>(a_rhs)->super_FabArray<amrex::FArrayBox>;
    lVar18 = **(long **)&(this->super_MLNodeLinOp).super_MLLinOp.m_factory.
                         super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[amrlev].
                         super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                         .
                         super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
    ;
    if (lVar18 == 0) {
      this_00 = (EBFArrayBoxFactory *)0x0;
    }
    else {
      this_00 = (EBFArrayBoxFactory *)
                __dynamic_cast(lVar18,&FabFactory<amrex::FArrayBox>::typeinfo,
                               &EBFArrayBoxFactory::typeinfo,0);
    }
    local_120 = &__return_storage_ptr__->super_vector<double,_std::allocator<double>_>;
    if (((mglev != 0) || (this_00 == (EBFArrayBoxFactory *)0x0)) ||
       (bVar15 = EBFArrayBoxFactory::isAllRegular(this_00), bVar15)) {
      lVar18 = *(long *)&(this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                         super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[amrlev].
                         super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                         super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
      puVar1 = (undefined8 *)(lVar18 + 0xac + (long)mglev * 200);
      uVar14 = puVar1[1];
      puVar2 = (undefined8 *)(lVar18 + 0xb8 + (long)mglev * 200);
      aiStack_1cc[1] = (int)((ulong)*puVar2 >> 0x20);
      uStack_1c4 = puVar2[1];
      local_1d8 = *puVar1;
      iStack_1d0 = (int)uVar14;
      aiStack_1cc[0] = (int)((ulong)uVar14 >> 0x20);
      lVar18 = 0;
      do {
        if ((uStack_1c4._4_4_ >> ((uint)lVar18 & 0x1f) & 1) == 0) {
          aiStack_1cc[lVar18] = aiStack_1cc[lVar18] + 1;
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != 3);
      uStack_1c4 = CONCAT44(7,(int)uStack_1c4);
      paVar9 = (this->super_MLNodeLinOp).super_MLLinOp.m_lobc.
               super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
               .
               super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      paVar10 = (this->super_MLNodeLinOp).super_MLLinOp.m_hibc.
                super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                .
                super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar18 = 0;
      do {
        LVar4 = paVar9->_M_elems[lVar18];
        if ((LVar4 != Neumann) && (LVar4 != inflow)) {
          piVar19 = (int *)((long)&local_1d8 + lVar18 * 4);
          *piVar19 = *piVar19 + -10;
        }
        LVar4 = paVar10->_M_elems[lVar18];
        if ((LVar4 != Neumann) && (LVar4 != inflow)) {
          aiStack_1cc[lVar18] = aiStack_1cc[lVar18] + 10;
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != 3);
      pFVar20 = &(this->super_MLNodeLinOp).m_bottom_dot_mask.super_FabArray<amrex::FArrayBox>;
      if (mglev + 1 !=
          *(this->super_MLNodeLinOp).super_MLLinOp.m_num_mg_levels.
           super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start) {
        pFVar20 = &(this->super_MLNodeLinOp).m_coarse_dot_mask.super_FabArray<amrex::FArrayBox>;
      }
      FabArray<amrex::FArrayBox>::build_arrays<amrex::FArrayBox,_0>(pFVar20);
      local_1a8._72_8_ = (pFVar20->m_const_arrays).hp;
      FabArray<amrex::FArrayBox>::build_arrays<amrex::FArrayBox,_0>(pFVar17);
      local_1a8._64_8_ = (pFVar17->m_const_arrays).hp;
      local_1e4.vect[0] = 0;
      local_1e4.vect[1] = 0;
      local_1e4.vect[2] = 0;
      local_1a8._56_8_ = SEXT48((int)local_1d8);
      local_1a8._88_4_ = local_1d8._4_4_;
      local_1a8._32_4_ = iStack_1d0;
      local_1a8._48_4_ = aiStack_1cc[0];
      local_1a8._80_4_ = aiStack_1cc[1];
      local_1fc.itype = (int)uStack_1c4;
      ReduceData<double,double>::ReduceData<amrex::ReduceOpSum,amrex::ReduceOpSum>
                ((ReduceData<double,double> *)local_110,&local_211);
      MFIter::MFIter(&local_d8,&pFVar17->super_FabArrayBase,true);
      if (local_d8.currentIndex < local_d8.endIndex) {
        do {
          MFIter::growntilebox((Box *)local_1a8,&local_d8,&local_1e4);
          piVar19 = &local_d8.currentIndex;
          if (local_d8.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
            piVar19 = ((local_d8.local_index_map)->super_vector<int,_std::allocator<int>_>).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start + local_d8.currentIndex;
          }
          local_1f8 = local_1a8._20_4_;
          local_1b8 = (ulong)(uint)local_1a8._8_4_;
          if ((int)local_1a8._8_4_ <= (int)local_1a8._20_4_) {
            local_1f4 = local_1a8._4_4_;
            local_208.m_value._0_4_ = local_1a8._16_4_;
            local_1f0 = (ulong)(int)local_1a8._0_4_;
            local_1a8._96_8_ = local_1a8._72_8_ + (long)*piVar19 * 0x40;
            local_1a8._104_8_ = (long)*piVar19 * 0x40 + local_1a8._64_8_;
            local_210.m_value._0_4_ = local_1a8._12_4_;
            local_1a8._40_8_ = local_1f0 * 8;
            do {
              if ((int)local_1a8._4_4_ <= (int)local_1a8._16_4_) {
                local_1a8._112_8_ = SEXT48((int)local_1b8);
                IVar23.itype = local_1a8._4_4_;
                do {
                  if ((int)local_1a8._0_4_ <= (int)local_1a8._12_4_) {
                    local_130._M_pi._0_1_ = local_1a8._88_4_ == IVar23.itype;
                    iVar5 = (((Array4<const_double> *)local_1a8._104_8_)->begin).y;
                    iVar6 = (((Array4<const_double> *)local_1a8._104_8_)->begin).z;
                    lVar18 = ((Array4<const_double> *)local_1a8._104_8_)->kstride;
                    lVar30 = ((Array4<const_double> *)local_1a8._104_8_)->jstride;
                    iVar7 = (((Array4<const_double> *)local_1a8._96_8_)->begin).z;
                    iVar8 = (((Array4<const_double> *)local_1a8._104_8_)->begin).x;
                    pdVar11 = ((Array4<const_double> *)local_1a8._104_8_)->p;
                    iVar22 = (((Array4<const_double> *)local_1a8._96_8_)->begin).y;
                    lVar21 = ((Array4<const_double> *)local_1a8._96_8_)->kstride;
                    lVar12 = ((Array4<const_double> *)local_1a8._96_8_)->jstride;
                    iVar24 = (((Array4<const_double> *)local_1a8._96_8_)->begin).x;
                    dVar31 = *local_110[0];
                    dVar32 = local_110[0][1];
                    pdVar13 = ((Array4<const_double> *)local_1a8._96_8_)->p;
                    lVar28 = 0;
                    do {
                      dVar33 = 0.5;
                      if (local_1a8._56_8_ - local_1f0 != lVar28) {
                        dVar33 = *(double *)
                                  (&DAT_007824d0 +
                                  (ulong)(local_1a8._48_4_ - local_1a8._0_4_ == (int)lVar28) * 8);
                      }
                      if (local_1a8._80_4_ == IVar23.itype || local_1a8._88_4_ == IVar23.itype) {
                        dVar33 = dVar33 * 0.5;
                      }
                      if (local_1fc.itype == (int)local_1b8 || local_1a8._32_4_ == (int)local_1b8) {
                        dVar33 = dVar33 * 0.5;
                      }
                      dVar3 = *(double *)
                               (local_1a8._40_8_ +
                               (long)(pdVar13 +
                                     (((local_1a8._112_8_ - (long)iVar7) * lVar21 +
                                      ((long)(int)IVar23.itype - (long)iVar22) * lVar12 + lVar28) -
                                     (long)iVar24)));
                      dVar31 = dVar31 + dVar33 * dVar3;
                      dVar32 = dVar32 + *(double *)
                                         (local_1a8._40_8_ +
                                         (long)(pdVar11 +
                                               (((local_1a8._112_8_ - (long)iVar6) * lVar18 +
                                                ((long)(int)IVar23.itype - (long)iVar5) * lVar30 +
                                                lVar28) - (long)iVar8))) * dVar3;
                      *local_110[0] = dVar31;
                      local_110[0][1] = dVar32;
                      lVar28 = lVar28 + 1;
                    } while ((local_1a8._12_4_ - local_1a8._0_4_) + 1 != (int)lVar28);
                  }
                  bVar15 = IVar23.itype != local_1a8._16_4_;
                  IVar23.itype = IVar23.itype + 1;
                } while (bVar15);
              }
              uVar16 = (int)local_1b8 + 1;
              bVar15 = (int)local_1b8 != local_1a8._20_4_;
              local_1b8 = (ulong)uVar16;
            } while (bVar15);
          }
          MFIter::operator++(&local_d8);
        } while (local_d8.currentIndex < local_d8.endIndex);
      }
      MFIter::~MFIter(&local_d8);
      gVar34 = (gpu_tuple_impl<0UL,_double,_double>)
               ReduceOps<amrex::ReduceOpSum,amrex::ReduceOpSum>::
               value<amrex::ReduceData<double,double>>
                         ((ReduceOps<amrex::ReduceOpSum,amrex::ReduceOpSum> *)&local_211,
                          (ReduceData<double,_double> *)local_110);
      local_210 = gVar34.super_gpu_tuple_element<0UL,_double>.m_value;
      local_208.m_value =
           (double)gVar34.super_gpu_tuple_impl<1UL,_double>.super_gpu_tuple_element<1UL,_double>.
                   m_value;
      if (local_e8 != (code *)0x0) {
        (*local_e8)(local_f8,local_f8,3);
        gVar34.super_gpu_tuple_element<0UL,_double>.m_value = local_210.m_value;
        gVar34.super_gpu_tuple_impl<1UL,_double>.super_gpu_tuple_element<1UL,_double>.m_value =
             (gpu_tuple_element<1UL,_double>)(gpu_tuple_element<1UL,_double>)local_208.m_value;
      }
      local_210 = gVar34.super_gpu_tuple_element<0UL,_double>.m_value;
      local_208.m_value =
           (double)gVar34.super_gpu_tuple_impl<1UL,_double>.super_gpu_tuple_element<1UL,_double>.
                   m_value;
      if (local_110[0] != (double *)0x0) {
        operator_delete(local_110[0],(long)local_100 - (long)local_110[0]);
        gVar34.super_gpu_tuple_element<0UL,_double>.m_value = local_210.m_value;
        gVar34.super_gpu_tuple_impl<1UL,_double>.super_gpu_tuple_element<1UL,_double>.m_value =
             (gpu_tuple_element<1UL,_double>)(gpu_tuple_element<1UL,_double>)local_208.m_value;
      }
      local_210 = gVar34.super_gpu_tuple_element<0UL,_double>.m_value;
      local_208.m_value =
           (double)gVar34.super_gpu_tuple_impl<1UL,_double>.super_gpu_tuple_element<1UL,_double>.
                   m_value;
      local_110[0] = (double *)local_210.m_value;
      local_d8.fabArray = (FabArrayBase *)local_1a8;
      local_1a8._0_8_ = local_208.m_value;
      __l._M_len = 2;
      __l._M_array = (iterator)&local_d8;
      local_d8.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
            )(__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
              )local_110;
      std::vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
      ::vector(&local_60,__l,(allocator_type *)&local_1e4);
      __return_storage_ptr__ = (Vector<double,_std::allocator<double>_> *)local_120;
      if (local_60.
          super__Vector_base<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.
                        super__Vector_base<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_60.
                              super__Vector_base<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.
                              super__Vector_base<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      local_d8.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
            )((double)local_110[0] / (double)local_1a8._0_8_);
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&local_d8;
      std::vector<double,_std::allocator<double>_>::vector
                (&__return_storage_ptr__->super_vector<double,_std::allocator<double>_>,__l_00,
                 (allocator_type *)&local_1e4);
    }
    else {
      pFVar20 = &EBDataCollection::getVolFrac
                           ((this_00->m_ebdc).
                            super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->super_FabArray<amrex::FArrayBox>;
      FabArray<amrex::FArrayBox>::build_arrays<amrex::FArrayBox,_0>(pFVar20);
      local_68 = (pFVar20->m_const_arrays).hp;
      lVar18 = *(long *)&(this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                         super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[amrlev].
                         super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                         super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
      aiStack_1cc[1] = (int)((ulong)*(undefined8 *)(lVar18 + 0xb8) >> 0x20);
      uStack_1c4 = *(undefined8 *)(lVar18 + 0xc0);
      local_1d8 = *(undefined8 *)(lVar18 + 0xac);
      iStack_1d0 = (int)*(undefined8 *)(lVar18 + 0xb4);
      aiStack_1cc[0] = (int)((ulong)*(undefined8 *)(lVar18 + 0xb4) >> 0x20);
      paVar9 = (this->super_MLNodeLinOp).super_MLLinOp.m_lobc.
               super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
               .
               super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      paVar10 = (this->super_MLNodeLinOp).super_MLLinOp.m_hibc.
                super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                .
                super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar18 = 0;
      do {
        LVar4 = paVar9->_M_elems[lVar18];
        if ((LVar4 != Neumann) && (LVar4 != inflow)) {
          piVar19 = (int *)((long)&local_1d8 + lVar18 * 4);
          *piVar19 = *piVar19 + -10;
        }
        LVar4 = paVar10->_M_elems[lVar18];
        if ((LVar4 != Neumann) && (LVar4 != inflow)) {
          aiStack_1cc[lVar18] = aiStack_1cc[lVar18] + 10;
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != 3);
      pFVar20 = &(this->super_MLNodeLinOp).m_bottom_dot_mask.super_FabArray<amrex::FArrayBox>;
      if (*(this->super_MLNodeLinOp).super_MLLinOp.m_num_mg_levels.
           super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start != 1) {
        pFVar20 = &(this->super_MLNodeLinOp).m_coarse_dot_mask.super_FabArray<amrex::FArrayBox>;
      }
      FabArray<amrex::FArrayBox>::build_arrays<amrex::FArrayBox,_0>(pFVar20);
      local_70 = (pFVar20->m_const_arrays).hp;
      FabArray<amrex::FArrayBox>::build_arrays<amrex::FArrayBox,_0>(pFVar17);
      iVar7 = aiStack_1cc[1];
      iVar6 = iStack_1d0;
      local_78 = (pFVar17->m_const_arrays).hp;
      local_1e4.vect[0] = 0;
      local_1e4.vect[1] = 0;
      local_1e4.vect[2] = 0;
      lVar18 = (long)(int)local_1d8;
      iVar5 = local_1d8._4_4_;
      lVar30 = (long)aiStack_1cc[0];
      iVar8 = (int)uStack_1c4;
      local_208.m_value = (double)pFVar17;
      ReduceData<double,double>::ReduceData<amrex::ReduceOpSum,amrex::ReduceOpSum>
                ((ReduceData<double,double> *)local_110,&local_211);
      MFIter::MFIter(&local_d8,(FabArrayBase *)local_208.m_value,true);
      if (local_d8.currentIndex < local_d8.endIndex) {
        do {
          MFIter::growntilebox((Box *)local_1a8,&local_d8,&local_1e4);
          piVar19 = &local_d8.currentIndex;
          if (local_d8.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
            piVar19 = ((local_d8.local_index_map)->super_vector<int,_std::allocator<int>_>).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start + local_d8.currentIndex;
          }
          local_124 = local_1a8._20_4_;
          local_1f0 = (ulong)(uint)local_1a8._8_4_;
          if ((int)local_1a8._8_4_ <= (int)local_1a8._20_4_) {
            local_1a8._40_8_ = local_110[0];
            local_118 = (pointer)(ulong)(uint)local_1a8._4_4_;
            local_1a8._72_8_ = ZEXT48((uint)local_1a8._12_4_);
            local_1fc.itype = local_1a8._16_4_;
            local_1a8._32_8_ = SEXT48((int)local_1a8._0_4_);
            iVar22 = *piVar19;
            local_1f4 = local_1a8._12_4_ + 1;
            local_1a8._64_4_ = local_1a8._0_4_ + -1;
            local_1a8._56_8_ = local_70 + iVar22;
            local_1a8._48_8_ = local_78 + iVar22;
            pAVar29 = local_68 + iVar22;
            local_1ac = local_1a8._8_4_ - indexType;
            local_128 = local_1a8._4_4_ - 1;
            do {
              if ((int)local_1a8._4_4_ <= (int)local_1a8._16_4_) {
                local_1b8 = (ulong)local_1ac;
                local_210.m_value = (double)local_118;
                local_1f8 = local_128;
                do {
                  if ((int)local_1a8._0_4_ <= (int)local_1a8._12_4_) {
                    local_130._M_pi =
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(long)local_1f8;
                    local_1a8._104_8_ =
                         SEXT48((((Array4<const_double> *)local_1a8._56_8_)->begin).x);
                    local_1a8._96_8_ =
                         ((Array4<const_double> *)local_1a8._56_8_)->p +
                         ((long)(int)local_210.m_value._0_4_ -
                         (long)(((Array4<const_double> *)local_1a8._56_8_)->begin).y) *
                         ((Array4<const_double> *)local_1a8._56_8_)->jstride +
                         ((long)(int)local_1f0 -
                         (long)(((Array4<const_double> *)local_1a8._56_8_)->begin).z) *
                         ((Array4<const_double> *)local_1a8._56_8_)->kstride;
                    local_1a8._88_8_ = SEXT48((((Array4<const_double> *)local_1a8._48_8_)->begin).x)
                    ;
                    local_1a8._80_8_ =
                         ((Array4<const_double> *)local_1a8._48_8_)->p +
                         ((long)(int)local_210.m_value._0_4_ -
                         (long)(((Array4<const_double> *)local_1a8._48_8_)->begin).y) *
                         ((Array4<const_double> *)local_1a8._48_8_)->jstride +
                         ((long)(int)local_1f0 -
                         (long)(((Array4<const_double> *)local_1a8._48_8_)->begin).z) *
                         ((Array4<const_double> *)local_1a8._48_8_)->kstride;
                    dVar31 = *local_110[0];
                    dVar32 = local_110[0][1];
                    lVar21 = local_1a8._32_8_;
                    iVar22 = local_1a8._0_4_ + -1;
                    do {
                      local_1a8._112_4_ = iVar22;
                      local_208.m_value = (double)(long)iVar22;
                      dVar33 = 0.0;
                      pFVar17 = (FabArray<amrex::FArrayBox> *)local_208.m_value;
                      uVar26 = local_1b8;
                      p_Var25 = local_130._M_pi;
                      do {
                        iVar24 = (int)p_Var25;
                        iVar27 = (int)uVar26;
                        if (((((lVar18 <= (long)pFVar17) && ((long)pFVar17 <= lVar30)) &&
                             (iVar5 <= iVar24)) && ((iVar24 <= iVar7 && (iVar6 <= iVar27)))) &&
                           (iVar27 <= iVar8)) {
                          dVar33 = dVar33 + pAVar29->p
                                            [(long)pFVar17 +
                                             (((uVar26 - (long)(pAVar29->begin).z) *
                                               pAVar29->kstride +
                                              ((long)p_Var25 - (long)(pAVar29->begin).y) *
                                              pAVar29->jstride) - (long)(pAVar29->begin).x)] * 0.125
                          ;
                        }
                        bVar15 = (long)pFVar17 < lVar21;
                        pFVar17 = (FabArray<amrex::FArrayBox> *)
                                  ((long)&(pFVar17->super_FabArrayBase)._vptr_FabArrayBase + 1);
                      } while (((bVar15) ||
                               (pFVar17 = (FabArray<amrex::FArrayBox> *)local_208.m_value,
                               p_Var25 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                         ((long)&p_Var25->_vptr__Sp_counted_base + 1),
                               iVar24 < (int)local_210.m_value._0_4_)) ||
                              (uVar26 = uVar26 + 1, p_Var25 = local_130._M_pi,
                              iVar27 < (int)local_1f0));
                      dVar3 = *(double *)(local_1a8._96_8_ + (lVar21 - local_1a8._104_8_) * 8);
                      dVar31 = dVar31 + dVar3 * dVar33;
                      dVar32 = dVar32 + dVar3 * *(double *)
                                                 (local_1a8._80_8_ + (lVar21 - local_1a8._88_8_) * 8
                                                 );
                      *local_110[0] = dVar31;
                      local_110[0][1] = dVar32;
                      lVar21 = lVar21 + 1;
                      iVar22 = iVar22 + 1;
                    } while (local_1f4 != (uint)lVar21);
                  }
                  uVar16 = local_210.m_value._0_4_ + 1;
                  local_1f8 = local_1f8 + 1;
                  bVar15 = local_210.m_value._0_4_ != local_1a8._16_4_;
                  local_210.m_value = (double)(ulong)uVar16;
                } while (bVar15);
              }
              uVar16 = (int)local_1f0 + 1;
              local_1ac = local_1ac + 1;
              bVar15 = (int)local_1f0 != local_1a8._20_4_;
              local_1f0 = (ulong)uVar16;
            } while (bVar15);
          }
          MFIter::operator++(&local_d8);
        } while (local_d8.currentIndex < local_d8.endIndex);
      }
      MFIter::~MFIter(&local_d8);
      gVar35 = (gpu_tuple_impl<0UL,_double,_double>)
               ReduceOps<amrex::ReduceOpSum,amrex::ReduceOpSum>::
               value<amrex::ReduceData<double,double>>
                         ((ReduceOps<amrex::ReduceOpSum,amrex::ReduceOpSum> *)&local_211,
                          (ReduceData<double,_double> *)local_110);
      local_210 = gVar35.super_gpu_tuple_element<0UL,_double>.m_value;
      local_208.m_value =
           (double)gVar35.super_gpu_tuple_impl<1UL,_double>.super_gpu_tuple_element<1UL,_double>.
                   m_value;
      if (local_e8 != (code *)0x0) {
        (*local_e8)(local_f8,local_f8,3);
        gVar35.super_gpu_tuple_element<0UL,_double>.m_value = local_210.m_value;
        gVar35.super_gpu_tuple_impl<1UL,_double>.super_gpu_tuple_element<1UL,_double>.m_value =
             (gpu_tuple_element<1UL,_double>)(gpu_tuple_element<1UL,_double>)local_208.m_value;
      }
      local_210 = gVar35.super_gpu_tuple_element<0UL,_double>.m_value;
      local_208.m_value =
           (double)gVar35.super_gpu_tuple_impl<1UL,_double>.super_gpu_tuple_element<1UL,_double>.
                   m_value;
      if (local_110[0] != (double *)0x0) {
        operator_delete(local_110[0],(long)local_100 - (long)local_110[0]);
        gVar35.super_gpu_tuple_element<0UL,_double>.m_value = local_210.m_value;
        gVar35.super_gpu_tuple_impl<1UL,_double>.super_gpu_tuple_element<1UL,_double>.m_value =
             (gpu_tuple_element<1UL,_double>)(gpu_tuple_element<1UL,_double>)local_208.m_value;
      }
      local_210 = gVar35.super_gpu_tuple_element<0UL,_double>.m_value;
      local_208.m_value =
           (double)gVar35.super_gpu_tuple_impl<1UL,_double>.super_gpu_tuple_element<1UL,_double>.
                   m_value;
      local_110[0] = (double *)local_210.m_value;
      local_d8.fabArray = (FabArrayBase *)local_1a8;
      local_1a8._0_8_ = local_208.m_value;
      __l_01._M_len = 2;
      __l_01._M_array = (iterator)&local_d8;
      local_d8.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
            )(__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
              )local_110;
      std::vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
      ::vector(&local_48,__l_01,(allocator_type *)&local_1e4);
      __return_storage_ptr__ = (Vector<double,_std::allocator<double>_> *)local_120;
      if (local_48.
          super__Vector_base<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.
                        super__Vector_base<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.
                              super__Vector_base<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      local_d8.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
            )((double)local_110[0] / (double)local_1a8._0_8_);
      __l_02._M_len = 1;
      __l_02._M_array = (iterator)&local_d8;
      std::vector<double,_std::allocator<double>_>::vector
                (&__return_storage_ptr__->super_vector<double,_std::allocator<double>_>,__l_02,
                 (allocator_type *)&local_1e4);
    }
  }
  else {
    MLNodeLinOp::getSolvabilityOffset
              (__return_storage_ptr__,&this->super_MLNodeLinOp,amrlev,mglev,a_rhs);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<Real>
MLNodeLaplacian::getSolvabilityOffset (int amrlev, int mglev, Any const& a_rhs) const
{
    amrex::ignore_unused(amrlev);
    AMREX_ASSERT(amrlev==0 && (mglev+1==m_num_mg_levels[0] || mglev==0));
    AMREX_ASSERT(getNComp() == 1);

    if (m_coarsening_strategy == CoarseningStrategy::RAP) {
        AMREX_ASSERT(a_rhs.is<MultiFab>());
        auto const& rhs = a_rhs.get<MultiFab>();

#ifdef AMREX_USE_EB
        auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][0].get());
        if (mglev == 0 && factory && !factory->isAllRegular()) {
            const MultiFab& vfrac = factory->getVolFrac();
            const auto& vfrac_ma = vfrac.const_arrays();

            Box dom = Geom(amrlev,mglev).Domain();
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                if (m_lobc[0][idim] != LinOpBCType::Neumann &&
                    m_lobc[0][idim] != LinOpBCType::inflow)
                {
                    dom.growLo(idim, 10);
                }
                if (m_hibc[0][idim] != LinOpBCType::Neumann &&
                    m_hibc[0][idim] != LinOpBCType::inflow)
                {
                    dom.growHi(idim, 10);
                }
            }

            const auto& mask = (mglev+1 == m_num_mg_levels[0]) ? m_bottom_dot_mask : m_coarse_dot_mask;
            const auto& mask_ma = mask.const_arrays();
            const auto& rhs_ma = rhs.const_arrays();
            auto r = ParReduce(TypeList<ReduceOpSum,ReduceOpSum>{}, TypeList<Real,Real>{},
                               rhs, IntVect(0),
                               [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
                               -> GpuTuple<Real,Real>
                               {
                                   Real scale = 0.0_rt;
#if (AMREX_SPACEDIM == 3)
                                   int const koff = 1;
                                   Real const fac = 0.125_rt;
#else
                                   int const koff = 0;
                                   Real const fac = 0.25_rt;
#endif
                                   for (int kc = k-koff; kc <= k; ++kc) {
                                   for (int jc = j-1   ; jc <= j; ++jc) {
                                   for (int ic = i-1   ; ic <= i; ++ic) {
                                       if (dom.contains(ic,jc,kc)) {
                                           scale += vfrac_ma[box_no](ic,jc,kc) * fac;
                                       }
                                   }}}
                                   return { mask_ma[box_no](i,j,k) * rhs_ma[box_no](i,j,k),
                                            mask_ma[box_no](i,j,k) * scale };
                               });

            Real s1 = amrex::get<0>(r);
            Real s2 = amrex::get<1>(r);
            ParallelAllReduce::Sum<Real>({s1,s2}, ParallelContext::CommunicatorSub());
            return {s1/s2};
        } else
#endif
        {
            Box nddom = amrex::surroundingNodes(Geom(amrlev,mglev).Domain());
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                if (m_lobc[0][idim] != LinOpBCType::Neumann &&
                    m_lobc[0][idim] != LinOpBCType::inflow)
                {
                    nddom.growLo(idim, 10); // so that the test in ParReduce will faill
                }
                if (m_hibc[0][idim] != LinOpBCType::Neumann &&
                    m_hibc[0][idim] != LinOpBCType::inflow)
                {
                    nddom.growHi(idim, 10);
                }
            }

            const auto& mask = (mglev+1 == m_num_mg_levels[0]) ? m_bottom_dot_mask : m_coarse_dot_mask;
            const auto& mask_ma = mask.const_arrays();
            const auto& rhs_ma = rhs.const_arrays();
            auto r = ParReduce(TypeList<ReduceOpSum,ReduceOpSum>{}, TypeList<Real,Real>{},
                               rhs, IntVect(0),
                               [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
                                   -> GpuTuple<Real,Real>
                               {
                                   Real scale = 1.0_rt;
                                   if (i == nddom.smallEnd(0) ||
                                       i == nddom.bigEnd(0)) {
                                       scale *= 0.5_rt;
                                   }
#if (AMREX_SPACEDIM >= 2)
                                   if (j == nddom.smallEnd(1) ||
                                       j == nddom.bigEnd(1)) {
                                       scale *= 0.5_rt;
                                   }
#endif
#if (AMREX_SPACEDIM == 3)
                                   if (k == nddom.smallEnd(2) ||
                                       k == nddom.bigEnd(2)) {
                                       scale *= 0.5_rt;
                                   }
#endif
                                   return { mask_ma[box_no](i,j,k) * rhs_ma[box_no](i,j,k),
                                            mask_ma[box_no](i,j,k) * scale };
                               });

            Real s1 = amrex::get<0>(r);
            Real s2 = amrex::get<1>(r);
            ParallelAllReduce::Sum<Real>({s1,s2}, ParallelContext::CommunicatorSub());
            return {s1/s2};
        }
    } else {
        return MLNodeLinOp::getSolvabilityOffset(amrlev, mglev, a_rhs);
    }
}